

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_subtree__print_dot_graph
               (Subtree *self,uint32_t start_offset,TSLanguage *language,TSSymbol alias_symbol,
               FILE *f)

{
  TSSymbol alias_symbol_00;
  _Bool _Var1;
  TSStateId TVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  char *string;
  TSSymbol *pTVar8;
  Subtree *self_00;
  TSSymbol local_60;
  TSSymbol alias_symbol_1;
  Subtree *child;
  uint32_t n;
  uint32_t i;
  TSSymbol *alias_sequence;
  uint32_t structural_child_index;
  uint32_t child_start_offset;
  uint32_t end_offset;
  TSSymbol symbol;
  TSSymbol subtree_symbol;
  FILE *f_local;
  TSSymbol alias_symbol_local;
  TSLanguage *language_local;
  uint32_t start_offset_local;
  Subtree *self_local;
  
  local_60 = ts_subtree_symbol(*self);
  if (alias_symbol != 0) {
    local_60 = alias_symbol;
  }
  uVar4 = ts_subtree_total_bytes(*self);
  fprintf((FILE *)f,"tree_%p [label=\"",self);
  string = ts_language_symbol_name(language,local_60);
  ts_subtree__write_dot_string(f,string);
  fprintf((FILE *)f,"\"");
  uVar5 = ts_subtree_child_count(*self);
  if (uVar5 == 0) {
    fprintf((FILE *)f,", shape=plaintext");
  }
  _Var1 = ts_subtree_extra(*self);
  if (_Var1) {
    fprintf((FILE *)f,", fontcolor=gray");
  }
  TVar2 = ts_subtree_parse_state(*self);
  uVar5 = ts_subtree_error_cost(*self);
  _Var1 = ts_subtree_has_changes(*self);
  uVar6 = ts_subtree_repeat_depth(*self);
  uVar7 = ts_subtree_lookahead_bytes(*self);
  fprintf((FILE *)f,
          ", tooltip=\"range: %u - %u\nstate: %d\nerror-cost: %u\nhas-changes: %u\nrepeat-depth: %u\nlookahead-bytes: %u\"]\n"
          ,(ulong)start_offset,(ulong)(start_offset + uVar4),(ulong)TVar2,(ulong)uVar5,(uint)_Var1,
          uVar6,uVar7);
  alias_sequence._0_4_ = 0;
  uVar3 = ts_subtree_alias_sequence_id(*self);
  pTVar8 = ts_language_alias_sequence(language,(uint)uVar3);
  child._4_4_ = 0;
  uVar4 = ts_subtree_child_count(*self);
  alias_sequence._4_4_ = start_offset;
  for (; child._4_4_ < uVar4; child._4_4_ = child._4_4_ + 1) {
    self_00 = (self->ptr->field_17).field_0.children + child._4_4_;
    _Var1 = ts_subtree_extra(*self_00);
    if (_Var1) {
      ts_subtree__print_dot_graph(self_00,alias_sequence._4_4_,language,0,f);
    }
    else {
      if (pTVar8 == (TSSymbol *)0x0) {
        alias_symbol_00 = 0;
      }
      else {
        alias_symbol_00 = pTVar8[(uint)alias_sequence];
      }
      ts_subtree__print_dot_graph(self_00,alias_sequence._4_4_,language,alias_symbol_00,f);
      alias_sequence._0_4_ = (uint)alias_sequence + 1;
    }
    fprintf((FILE *)f,"tree_%p -> tree_%p [tooltip=%u]\n",self,self_00,(ulong)child._4_4_);
    uVar5 = ts_subtree_total_bytes(*self_00);
    alias_sequence._4_4_ = uVar5 + alias_sequence._4_4_;
  }
  return;
}

Assistant:

void ts_subtree__print_dot_graph(const Subtree *self, uint32_t start_offset,
                                 const TSLanguage *language, TSSymbol alias_symbol,
                                 FILE *f) {
  TSSymbol subtree_symbol = ts_subtree_symbol(*self);
  TSSymbol symbol = alias_symbol ? alias_symbol : subtree_symbol;
  uint32_t end_offset = start_offset + ts_subtree_total_bytes(*self);
  fprintf(f, "tree_%p [label=\"", self);
  ts_subtree__write_dot_string(f, ts_language_symbol_name(language, symbol));
  fprintf(f, "\"");

  if (ts_subtree_child_count(*self) == 0) fprintf(f, ", shape=plaintext");
  if (ts_subtree_extra(*self)) fprintf(f, ", fontcolor=gray");

  fprintf(f, ", tooltip=\""
    "range: %u - %u\n"
    "state: %d\n"
    "error-cost: %u\n"
    "has-changes: %u\n"
    "repeat-depth: %u\n"
    "lookahead-bytes: %u\"]\n",
    start_offset, end_offset,
    ts_subtree_parse_state(*self),
    ts_subtree_error_cost(*self),
    ts_subtree_has_changes(*self),
    ts_subtree_repeat_depth(*self),
    ts_subtree_lookahead_bytes(*self)
  );

  uint32_t child_start_offset = start_offset;
  uint32_t structural_child_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    language,
    ts_subtree_alias_sequence_id(*self)
  );
  for (uint32_t i = 0, n = ts_subtree_child_count(*self); i < n; i++) {
    const Subtree *child = &self->ptr->children[i];
    if (ts_subtree_extra(*child)) {
      ts_subtree__print_dot_graph(child, child_start_offset, language, 0, f);
    } else {
      TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
      ts_subtree__print_dot_graph(child, child_start_offset, language, alias_symbol, f);
      structural_child_index++;
    }
    fprintf(f, "tree_%p -> tree_%p [tooltip=%u]\n", self, child, i);
    child_start_offset += ts_subtree_total_bytes(*child);
  }
}